

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttreader.cc
# Opt level: O2

int __thiscall libwebvtt::VttReader::Open(VttReader *this,char *filename)

{
  int iVar1;
  FILE *pFVar2;
  
  iVar1 = -1;
  if ((filename != (char *)0x0) && (this->file_ == (FILE *)0x0)) {
    pFVar2 = fopen(filename,"rb");
    this->file_ = (FILE *)pFVar2;
    iVar1 = -(uint)(pFVar2 == (FILE *)0x0);
  }
  return iVar1;
}

Assistant:

int VttReader::Open(const char* filename) {
  if (filename == NULL || file_ != NULL)
    return -1;

  file_ = fopen(filename, "rb");
  if (file_ == NULL)
    return -1;

  return 0;  // success
}